

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

boolean_validator __thiscall goodform::sub_form::boolean(sub_form *this)

{
  bool bVar1;
  undefined1 uVar2;
  bool *pbVar3;
  allocator<char> local_51;
  string local_50;
  error_message local_30;
  
  bVar1 = is<bool>(this->variant_);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"TYPE NOT BOOLEAN",&local_51);
    error_message::error_message(&local_30,&local_50);
    std::__cxx11::string::operator=((string *)this->error_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar1 = is<bool>(this->variant_);
  if (bVar1) {
    pbVar3 = std::any_cast<bool_const&>(this->variant_);
    uVar2 = *pbVar3;
  }
  else {
    uVar2 = 0;
  }
  return (boolean_validator)(bool)uVar2;
}

Assistant:

boolean_validator sub_form::boolean()
  {
    if (!is<bool>(this->variant_))
      this->error_ = error_message("TYPE NOT BOOLEAN");

    boolean_validator ret(is<bool>(this->variant_) ? get<bool>(this->variant_) : false);
    return ret;
  }